

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

type __thiscall
chrono::ChValueSpecific<double[3]>::_get_name_string<double[3]>(ChValueSpecific<double[3]> *this)

{
  int iVar1;
  allocator local_11;
  ChValueSpecific<double[3]> *local_10;
  ChValueSpecific<double[3]> *this_local;
  
  if (_get_name_string<double[3]>()::nostring_abi_cxx11_ == '\0') {
    local_10 = this;
    iVar1 = __cxa_guard_acquire(&_get_name_string<double[3]>()::nostring_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&_get_name_string<double[3]>()::nostring_abi_cxx11_,"",&local_11);
      std::allocator<char>::~allocator((allocator<char> *)&local_11);
      __cxa_atexit(std::__cxx11::string::~string,&_get_name_string<double[3]>()::nostring_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&_get_name_string<double[3]>()::nostring_abi_cxx11_);
    }
  }
  return &_get_name_string<double[3]>()::nostring_abi_cxx11_;
}

Assistant:

typename enable_if< !ChDetect_ArchiveContainerName<Tc>::value, std::string& >::type 
        _get_name_string() {
            static std::string nostring(""); 
            return nostring; // nothing to do if not provided
        }